

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.h
# Opt level: O0

quicly_sent_t * quicly_sentmap_allocate(quicly_sentmap_t *map,quicly_sent_acked_cb acked)

{
  size_t sVar1;
  quicly_sent_acked_cb in_RSI;
  long in_RDI;
  quicly_sent_t *sent;
  st_quicly_sent_block_t *block;
  quicly_sentmap_t *in_stack_ffffffffffffffd8;
  st_quicly_sent_block_t *local_20;
  quicly_sent_t *local_8;
  
  local_20 = *(st_quicly_sent_block_t **)(in_RDI + 8);
  if (((local_20 == (st_quicly_sent_block_t *)0x0) || (local_20->next_insert_at == 0x10)) &&
     (local_20 = quicly_sentmap__new_block(in_stack_ffffffffffffffd8),
     local_20 == (st_quicly_sent_block_t *)0x0)) {
    local_8 = (quicly_sent_t *)0x0;
  }
  else {
    sVar1 = local_20->next_insert_at;
    local_20->next_insert_at = sVar1 + 1;
    local_8 = local_20->entries + sVar1;
    local_20->num_entries = local_20->num_entries + 1;
    local_8->acked = in_RSI;
  }
  return local_8;
}

Assistant:

inline quicly_sent_t *quicly_sentmap_allocate(quicly_sentmap_t *map, quicly_sent_acked_cb acked)
{
    struct st_quicly_sent_block_t *block;

    if ((block = map->tail) == NULL || block->next_insert_at == PTLS_ELEMENTSOF(block->entries)) {
        if ((block = quicly_sentmap__new_block(map)) == NULL)
            return NULL;
    }

    quicly_sent_t *sent = block->entries + block->next_insert_at++;
    ++block->num_entries;

    sent->acked = acked;

    return sent;
}